

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall parser::~parser(parser *this)

{
  long in_RDI;
  ptr_queue<example> *this_00;
  
  if (*(long **)(in_RDI + 0x1e8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x1e8) + 0x18))();
  }
  this_00 = *(ptr_queue<example> **)(in_RDI + 0x208);
  if (this_00 != (ptr_queue<example> *)0x0) {
    (**(code **)(this_00->max_size + 0x18))();
  }
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)0x1bc253);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x260));
  VW::ptr_queue<example>::~ptr_queue(this_00);
  VW::object_pool<example,_example_initializer>::~object_pool
            ((object_pool<example,_example_initializer> *)this_00);
  return;
}

Assistant:

~parser()
  {
    delete input;
    delete output;
  }